

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_write_disk_hardlink.c
# Opt level: O3

void test_write_disk_hardlink(void)

{
  int iVar1;
  archive *a;
  archive_entry *paVar2;
  ssize_t sVar3;
  
  assertion_umask("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                  ,L'7',L'\x12');
  a = archive_write_disk_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L':',(uint)(a != (archive *)0x0),"(ad = archive_write_disk_new()) != NULL",
                   (void *)0x0);
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'B',(uint)(paVar2 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar2,"link1a");
  archive_entry_set_mode(paVar2,0x81ed);
  archive_entry_set_size(paVar2,0x1b);
  iVar1 = archive_write_header(a,paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'F',0,"0",(long)iVar1,"archive_write_header(ad, ae)",a);
  sVar3 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'H',0x1b,"sizeof(data)",sVar3,"archive_write_data(ad, data, sizeof(data))",
                      (void *)0x0);
  iVar1 = archive_write_finish_entry(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'I',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  archive_entry_free(paVar2);
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'M',(uint)(paVar2 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar2,"link1b");
  archive_entry_set_mode(paVar2,0x81a2);
  archive_entry_set_size(paVar2,0);
  archive_entry_copy_hardlink(paVar2,"link1a");
  iVar1 = archive_write_header(a,paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'R',0,"0",(long)iVar1,"r = archive_write_header(ad, ae)",a);
  if (-0x15 < iVar1) {
    sVar3 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'U',-0x14,"ARCHIVE_WARN",sVar3,
                        "archive_write_data(ad, data, sizeof(data))",(void *)0x0);
    iVar1 = archive_write_finish_entry(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'V',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  }
  archive_entry_free(paVar2);
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'`',(uint)(paVar2 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar2,"link2a");
  archive_entry_set_mode(paVar2,0x81ed);
  archive_entry_set_size(paVar2,0x1b);
  iVar1 = archive_write_header(a,paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'd',0,"0",(long)iVar1,"archive_write_header(ad, ae)",a);
  sVar3 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'f',0x1b,"sizeof(data)",sVar3,"archive_write_data(ad, data, sizeof(data))",
                      (void *)0x0);
  iVar1 = archive_write_finish_entry(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'g',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  archive_entry_free(paVar2);
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'k',(uint)(paVar2 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar2,"link2b");
  archive_entry_set_mode(paVar2,0x81a2);
  archive_entry_unset_size(paVar2);
  archive_entry_copy_hardlink(paVar2,"link2a");
  iVar1 = archive_write_header(a,paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'p',0,"0",(long)iVar1,"r = archive_write_header(ad, ae)",a);
  if (-0x15 < iVar1) {
    sVar3 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L's',-0x14,"ARCHIVE_WARN",sVar3,
                        "archive_write_data(ad, data, sizeof(data))",(void *)0x0);
    iVar1 = archive_write_finish_entry(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L't',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  }
  archive_entry_free(paVar2);
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'~',(uint)(paVar2 != (archive_entry *)0x0),"(ae = archive_entry_new()) != NULL"
                   ,(void *)0x0);
  archive_entry_copy_pathname(paVar2,"link3a");
  archive_entry_set_mode(paVar2,0x8180);
  archive_entry_set_size(paVar2,0x1b);
  iVar1 = archive_write_header(a,paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'\x82',0,"0",(long)iVar1,"archive_write_header(ad, ae)",a);
  sVar3 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'\x83',0x1b,"sizeof(data)",sVar3,
                      "archive_write_data(ad, data, sizeof(data))",(void *)0x0);
  iVar1 = archive_write_finish_entry(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'\x84',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  archive_entry_free(paVar2);
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'\x88',(uint)(paVar2 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar2,"link3b");
  archive_entry_set_mode(paVar2,0x81ed);
  archive_entry_set_size(paVar2,0x1b);
  archive_entry_copy_hardlink(paVar2,"link3a");
  iVar1 = archive_write_header(a,paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'\x8d',0,"0",(long)iVar1,"r = archive_write_header(ad, ae)",a);
  if (-0x14 < iVar1) {
    sVar3 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'\x90',0x1b,"sizeof(data)",sVar3,
                        "archive_write_data(ad, data, sizeof(data))",(void *)0x0);
    iVar1 = archive_write_finish_entry(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'\x91',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  }
  archive_entry_free(paVar2);
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'\x9b',(uint)(paVar2 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar2,"link4a");
  archive_entry_set_mode(paVar2,0x8180);
  archive_entry_set_size(paVar2,0);
  iVar1 = archive_write_header(a,paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'\x9f',0,"0",(long)iVar1,"archive_write_header(ad, ae)",a);
  sVar3 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'\xa0',-0x14,"ARCHIVE_WARN",sVar3,"archive_write_data(ad, data, 1)",
                      (void *)0x0);
  iVar1 = archive_write_finish_entry(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'¡',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  archive_entry_free(paVar2);
  paVar2 = archive_entry_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'¥',(uint)(paVar2 != (archive_entry *)0x0),
                   "(ae = archive_entry_new()) != NULL",(void *)0x0);
  archive_entry_copy_pathname(paVar2,"link4b");
  archive_entry_set_mode(paVar2,0x81ed);
  archive_entry_set_size(paVar2,0x1b);
  archive_entry_copy_hardlink(paVar2,"link4a");
  iVar1 = archive_write_header(a,paVar2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'ª',0,"0",(long)iVar1,"r = archive_write_header(ad, ae)",a);
  if (-0x19 < iVar1) {
    sVar3 = archive_write_data(a,"abcdefghijklmnopqrstuvwxyz",0x1b);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'­',0x1b,"sizeof(data)",sVar3,
                        "archive_write_data(ad, data, sizeof(data))",(void *)0x0);
    iVar1 = archive_write_finish_entry(a);
    assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                        ,L'®',0,"0",(long)iVar1,"archive_write_finish_entry(ad)",a);
  }
  archive_entry_free(paVar2);
  iVar1 = archive_write_free(a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'±',0,"0",(long)iVar1,"archive_write_free(ad)",(void *)0x0);
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'º',"link1a",L'ǭ');
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'»',"link1a",0x1b);
  assertion_file_nlinks
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'¼',"link1a",L'\x02');
  assertion_is_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'½',"link1a","link1b");
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'Æ',"link2a",L'ǭ');
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'Ç',"link2a",0x1b);
  assertion_file_nlinks
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'È',"link2a",L'\x02');
  assertion_is_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'É',"link2a","link2b");
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'Ì',"link3a",L'ǭ');
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'Í',"link3a",0x1b);
  assertion_file_nlinks
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'Î',"link3a",L'\x02');
  assertion_is_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'Ï',"link3a","link3b");
  assertion_is_reg("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                   ,L'Ò',"link4a",L'ǭ');
  assertion_file_nlinks
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'Ó',"link4a",L'\x02');
  assertion_file_size("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
                      ,L'Ô',"link4a",0x1b);
  assertion_is_hardlink
            ("/workspace/llm4binary/github/license_all_cmakelists_25/benesch[P]libarchive/libarchive/test/test_write_disk_hardlink.c"
             ,L'Õ',"link4a","link4b");
  return;
}

Assistant:

DEFINE_TEST(test_write_disk_hardlink)
{
#if defined(__HAIKU__)
	skipping("archive_write_disk_hardlink; hardlinks are not supported on bfs");
#else
	static const char data[]="abcdefghijklmnopqrstuvwxyz";
	struct archive *ad;
	struct archive_entry *ae;
	int r;

	/* Force the umask to something predictable. */
	assertUmask(UMASK);

	/* Write entries to disk. */
	assert((ad = archive_write_disk_new()) != NULL);

	/*
	 * First, use a tar-like approach; a regular file, then
	 * a separate "hardlink" entry.
	 */

	/* Regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link1a");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(sizeof(data),
	    archive_write_data(ad, data, sizeof(data)));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Link.  Size of zero means this doesn't carry data. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link1b");
	archive_entry_set_mode(ae, S_IFREG | 0642);
	archive_entry_set_size(ae, 0);
	archive_entry_copy_hardlink(ae, "link1a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r >= ARCHIVE_WARN) {
		assertEqualInt(ARCHIVE_WARN,
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);

	/*
	 * Repeat tar approach test, but use unset to mark the
	 * hardlink as having no data.
	 */

	/* Regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link2a");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(sizeof(data),
	    archive_write_data(ad, data, sizeof(data)));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Link.  Unset size means this doesn't carry data. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link2b");
	archive_entry_set_mode(ae, S_IFREG | 0642);
	archive_entry_unset_size(ae);
	archive_entry_copy_hardlink(ae, "link2a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r >= ARCHIVE_WARN) {
		assertEqualInt(ARCHIVE_WARN,
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);

	/*
	 * Second, try an old-cpio-like approach; a regular file, then
	 * another identical one (which has been marked hardlink).
	 */

	/* Regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link3a");
	archive_entry_set_mode(ae, S_IFREG | 0600);
	archive_entry_set_size(ae, sizeof(data));
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(sizeof(data), archive_write_data(ad, data, sizeof(data)));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Link. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link3b");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	archive_entry_copy_hardlink(ae, "link3a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r > ARCHIVE_WARN) {
		assertEqualInt(sizeof(data),
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);

	/*
	 * Finally, try a new-cpio-like approach, where the initial
	 * regular file is empty and the hardlink has the data.
	 */

	/* Regular file. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link4a");
	archive_entry_set_mode(ae, S_IFREG | 0600);
	archive_entry_set_size(ae, 0);
	assertEqualIntA(ad, 0, archive_write_header(ad, ae));
	assertEqualInt(ARCHIVE_WARN, archive_write_data(ad, data, 1));
	assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	archive_entry_free(ae);

	/* Link. */
	assert((ae = archive_entry_new()) != NULL);
	archive_entry_copy_pathname(ae, "link4b");
	archive_entry_set_mode(ae, S_IFREG | 0755);
	archive_entry_set_size(ae, sizeof(data));
	archive_entry_copy_hardlink(ae, "link4a");
	assertEqualIntA(ad, 0, r = archive_write_header(ad, ae));
	if (r > ARCHIVE_FAILED) {
		assertEqualInt(sizeof(data),
		    archive_write_data(ad, data, sizeof(data)));
		assertEqualIntA(ad, 0, archive_write_finish_entry(ad));
	}
	archive_entry_free(ae);
	assertEqualInt(0, archive_write_free(ad));

	/* Test the entries on disk. */

	/* Test #1 */
	/* If the hardlink was successfully created and the archive
	 * doesn't carry data for it, we consider it to be
	 * non-authoritative for meta data as well.  This is consistent
	 * with GNU tar and BSD pax.  */
	assertIsReg("link1a", 0755 & ~UMASK);
	assertFileSize("link1a", sizeof(data));
	assertFileNLinks("link1a", 2);
	assertIsHardlink("link1a", "link1b");

	/* Test #2: Should produce identical results to test #1 */
	/* Note that marking a hardlink with size = 0 is treated the
	 * same as having an unset size.  This is partly for backwards
	 * compatibility (we used to not have unset tracking, so
	 * relied on size == 0) and partly to match the model used by
	 * common file formats that store a size of zero for
	 * hardlinks. */
	assertIsReg("link2a", 0755 & ~UMASK);
	assertFileSize("link2a", sizeof(data));
	assertFileNLinks("link2a", 2);
	assertIsHardlink("link2a", "link2b");

	/* Test #3 */
	assertIsReg("link3a", 0755 & ~UMASK);
	assertFileSize("link3a", sizeof(data));
	assertFileNLinks("link3a", 2);
	assertIsHardlink("link3a", "link3b");

	/* Test #4 */
	assertIsReg("link4a", 0755 & ~UMASK);
	assertFileNLinks("link4a", 2);
	assertFileSize("link4a", sizeof(data));
	assertIsHardlink("link4a", "link4b");
#endif
}